

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void ImStb::stb_textedit_delete(ImGuiInputTextState *str,STB_TexteditState *state,int where,int len)

{
  unsigned_short *puVar1;
  ImWchar *pIVar2;
  ulong uVar3;
  
  pIVar2 = stb_text_createundo(&state->undostate,where,len,0);
  if (0 < len && pIVar2 != (ImWchar *)0x0) {
    puVar1 = (str->TextW).Data;
    uVar3 = 0;
    do {
      pIVar2[uVar3] = puVar1[(long)where + uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}